

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>_>
 __thiscall
wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)17>,wabt::Var,wabt::Location&>
          (wabt *this,Var *args,Location *args_1)

{
  VarExpr<(wabt::ExprType)17> *this_00;
  Location *args_local_1;
  Var *args_local;
  
  this_00 = (VarExpr<(wabt::ExprType)17> *)operator_new(0x88);
  VarExpr<(wabt::ExprType)17>::VarExpr(this_00,args,args_1);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)17>,std::default_delete<wabt::VarExpr<(wabt::ExprType)17>>>
  ::unique_ptr<std::default_delete<wabt::VarExpr<(wabt::ExprType)17>>,void>
            ((unique_ptr<wabt::VarExpr<(wabt::ExprType)17>,std::default_delete<wabt::VarExpr<(wabt::ExprType)17>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)17>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)17>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}